

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O0

uchar __thiscall YAML::Stream::GetNextByte(Stream *this)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 *in_RDI;
  streambuf *pBuf;
  
  if ((ulong)in_RDI[0xe] <= (ulong)in_RDI[0xf]) {
    pcVar2 = (char *)std::ios::rdbuf();
    pcVar3 = ReadBuffer((uchar *)in_RDI[0xd]);
    uVar4 = std::streambuf::sgetn(pcVar2,(long)pcVar3);
    in_RDI[0xe] = uVar4;
    in_RDI[0xf] = 0;
    if (in_RDI[0xe] == 0) {
      std::ios::setstate((int)(long *)*in_RDI + (int)*(undefined8 *)(*(long *)*in_RDI + -0x18));
    }
    if (in_RDI[0xe] == 0) {
      return '\0';
    }
  }
  lVar1 = in_RDI[0xf];
  in_RDI[0xf] = lVar1 + 1;
  return *(uchar *)(in_RDI[0xd] + lVar1);
}

Assistant:

unsigned char Stream::GetNextByte() const {
  if (m_nPrefetchedUsed >= m_nPrefetchedAvailable) {
    std::streambuf* pBuf = m_input.rdbuf();
    m_nPrefetchedAvailable = static_cast<std::size_t>(
        pBuf->sgetn(ReadBuffer(m_pPrefetched), YAML_PREFETCH_SIZE));
    m_nPrefetchedUsed = 0;
    if (!m_nPrefetchedAvailable) {
      m_input.setstate(std::ios_base::eofbit);
    }

    if (0 == m_nPrefetchedAvailable) {
      return 0;
    }
  }

  return m_pPrefetched[m_nPrefetchedUsed++];
}